

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O3

void __thiscall testing::internal::StreamingListener::Start(StreamingListener *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"gtest_streaming_protocol_version=1.0","");
  AbstractSocketWriter::SendLn((this->socket_writer_).ptr_,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Start() { SendLn("gtest_streaming_protocol_version=1.0"); }